

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFLoader.cpp
# Opt level: O0

void __thiscall
Assimp::DXFImporter::ParseEntities(DXFImporter *this,LineReader *reader,FileData *output)

{
  bool bVar1;
  LineReader *pLVar2;
  Logger *this_00;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar3;
  basic_formatter *this_01;
  byte local_261;
  size_type local_248;
  size_type local_240;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  string local_c0;
  reference local_a0;
  Block *block;
  Block local_88;
  FileData *local_20;
  FileData *output_local;
  LineReader *reader_local;
  DXFImporter *this_local;
  
  local_88.base.x = 0.0;
  local_88.base.y = 0.0;
  local_88.base.z = 0.0;
  local_88._92_4_ = 0;
  local_88.name.field_2._M_allocated_capacity = 0;
  local_88.name.field_2._8_8_ = 0;
  local_88.name._M_dataplus = (_Alloc_hider)0x0;
  local_88.name._1_7_ = 0;
  local_88.name._M_string_length = 0;
  local_88.insertions.
  super__Vector_base<Assimp::DXF::InsertBlock,_std::allocator<Assimp::DXF::InsertBlock>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.insertions.
  super__Vector_base<Assimp::DXF::InsertBlock,_std::allocator<Assimp::DXF::InsertBlock>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.lines.
  super__Vector_base<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.insertions.
  super__Vector_base<Assimp::DXF::InsertBlock,_std::allocator<Assimp::DXF::InsertBlock>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.lines.
  super__Vector_base<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.lines.
  super__Vector_base<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_20 = output;
  output_local = (FileData *)reader;
  reader_local = (LineReader *)this;
  DXF::Block::Block(&local_88);
  std::vector<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>::push_back
            (&output->blocks,&local_88);
  DXF::Block::~Block(&local_88);
  local_a0 = std::vector<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>::back
                       (&local_20->blocks);
  std::__cxx11::string::operator=((string *)&local_a0->name,"$ASSIMP_ENTITIES_MAGIC");
LAB_006a34bd:
  do {
    while( true ) {
      while( true ) {
        bVar1 = DXF::LineReader::End((LineReader *)output_local);
        local_261 = 0;
        if (!bVar1) {
          bVar1 = DXF::LineReader::Is((LineReader *)output_local,0,"ENDSEC");
          local_261 = bVar1 ^ 0xff;
        }
        if ((local_261 & 1) == 0) {
          this_00 = DefaultLogger::get();
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[10]>(&local_238,(char (*) [10])"DXF: got ");
          local_240 = std::
                      vector<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
                      ::size(&local_a0->lines);
          pbVar3 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                   Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                   operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                             &local_238,&local_240);
          pbVar3 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                   Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                   operator_(pbVar3,(char (*) [16])" polylines and ");
          local_248 = std::
                      vector<Assimp::DXF::InsertBlock,_std::allocator<Assimp::DXF::InsertBlock>_>::
                      size(&local_a0->insertions);
          pbVar3 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                   Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                   operator_(pbVar3,&local_248);
          this_01 = (basic_formatter *)
                    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                    operator_(pbVar3,(char (*) [29])" inserted blocks in ENTITIES");
          Formatter::basic_formatter::operator_cast_to_string(&local_c0,this_01);
          Logger::debug(this_00,&local_c0);
          std::__cxx11::string::~string((string *)&local_c0);
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          ~basic_formatter(&local_238);
          return;
        }
        bVar1 = DXF::LineReader::Is((LineReader *)output_local,0,"POLYLINE");
        if (!bVar1) break;
        pLVar2 = DXF::LineReader::operator++((LineReader *)output_local);
        ParsePolyLine(this,pLVar2,local_20);
      }
      bVar1 = DXF::LineReader::Is((LineReader *)output_local,0,"INSERT");
      if (!bVar1) break;
      pLVar2 = DXF::LineReader::operator++((LineReader *)output_local);
      ParseInsertion(this,pLVar2,local_20);
    }
    bVar1 = DXF::LineReader::Is((LineReader *)output_local,0,"3DFACE");
    if (!bVar1) {
      bVar1 = DXF::LineReader::Is((LineReader *)output_local,0,"LINE");
      if (!bVar1) {
        bVar1 = DXF::LineReader::Is((LineReader *)output_local,0,"3DLINE");
        if (!bVar1) {
          DXF::LineReader::operator++((LineReader *)output_local);
          goto LAB_006a34bd;
        }
      }
    }
    pLVar2 = DXF::LineReader::operator++((LineReader *)output_local);
    Parse3DFace(this,pLVar2,local_20);
  } while( true );
}

Assistant:

void DXFImporter::ParseEntities(DXF::LineReader& reader, DXF::FileData& output) {
    // Push a new block onto the stack.
    output.blocks.push_back( DXF::Block() );
    DXF::Block& block = output.blocks.back();

    block.name = AI_DXF_ENTITIES_MAGIC_BLOCK;

    while( !reader.End() && !reader.Is(0,"ENDSEC")) {
        if (reader.Is(0,"POLYLINE")) {
            ParsePolyLine(++reader,output);
            continue;
        }

        else if (reader.Is(0,"INSERT")) {
            ParseInsertion(++reader,output);
            continue;
        }

        else if (reader.Is(0,"3DFACE") || reader.Is(0,"LINE") || reader.Is(0,"3DLINE")) {
            //http://sourceforge.net/tracker/index.php?func=detail&aid=2970566&group_id=226462&atid=1067632
            Parse3DFace(++reader, output);
            continue;
        }

        ++reader;
    }

    ASSIMP_LOG_DEBUG_F( "DXF: got ", block.lines.size()," polylines and ", block.insertions.size(), 
        " inserted blocks in ENTITIES" );
}